

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.c
# Opt level: O0

void mixed_free_pack(mixed_pack *pack)

{
  mixed_pack *pack_local;
  
  if (pack->_data != (uchar *)0x0) {
    (*mixed_free)(pack->_data);
  }
  pack->_data = (uchar *)0x0;
  pack->size = 0;
  mixed_pack_clear(pack);
  return;
}

Assistant:

MIXED_EXPORT void mixed_free_pack(struct mixed_pack *pack){
  if(pack->_data)
    mixed_free(pack->_data);
  pack->_data = 0;
  pack->size = 0;
  mixed_pack_clear(pack);
}